

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtxml.cpp
# Opt level: O0

void write_tabs(FileStream *os)

{
  FileStream *fileStream;
  UnicodeString local_58;
  int local_14;
  FileStream *pFStack_10;
  int i;
  FileStream *os_local;
  
  pFStack_10 = os;
  for (local_14 = 0; fileStream = pFStack_10, local_14 <= tabCount; local_14 = local_14 + 1) {
    icu_63::UnicodeString::UnicodeString(&local_58,"    ");
    write_utf8_file(fileStream,&local_58);
    icu_63::UnicodeString::~UnicodeString(&local_58);
  }
  return;
}

Assistant:

static void write_tabs(FileStream* os){
    int i=0;
    for(;i<=tabCount;i++){
        write_utf8_file(os,UnicodeString("    "));
    }
}